

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * CompileVmTypeCast(ExpressionContext *ctx,VmModule *module,ExprTypeCast *node)

{
  VmValueType VVar1;
  uint uVar2;
  TypeBase *pTVar3;
  undefined1 auVar4 [16];
  VmValueType VVar5;
  VmModule *address;
  VmConstant *el0;
  TypeRef *pTVar6;
  VmConstant *pVVar7;
  VmModule *pVVar8;
  VmModule *pVVar9;
  VmValue *pVVar10;
  VmValue *pVVar11;
  VmValue *pVVar12;
  SynBase *pSVar13;
  uint uVar14;
  TypeBase *pTVar15;
  uint in_R9D;
  VmType VVar16;
  VmType type;
  VmType type_00;
  VmType type_01;
  uint in_stack_ffffffffffffff98;
  VmConstant *el2;
  VmValue *in_stack_ffffffffffffffa0;
  VmValue *in_stack_ffffffffffffffb8;
  
  address = (VmModule *)CompileVm(ctx,module,node->value);
  pVVar9 = address;
  switch(node->category) {
  case EXPR_CAST_NUMERICAL:
    pTVar15 = (node->super_ExprBase).type;
    if (pTVar15 == ctx->typeBool) {
      VVar1 = ((VmType *)&(address->functions).tail)->type;
      uVar2 = ((VmType *)&(address->functions).tail)->size;
      if (uVar2 == 4 && VVar1 == VM_TYPE_INT) {
        pSVar13 = (node->super_ExprBase).source;
        pVVar7 = CreateConstantInt(module->allocator,pSVar13,0);
      }
      else if (uVar2 == 8 && VVar1 == VM_TYPE_DOUBLE) {
        pSVar13 = (node->super_ExprBase).source;
        pVVar7 = CreateConstantDouble(module->allocator,pSVar13,0.0);
      }
      else {
        if ((VVar1 != VM_TYPE_LONG) || (uVar2 != 8)) {
          __assert_fail("!\"unknown type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0xa95,
                        "VmValue *CompileVmTypeCast(ExpressionContext &, VmModule *, ExprTypeCast *)"
                       );
        }
        pSVar13 = (node->super_ExprBase).source;
        pVVar7 = CreateConstantLong(module->allocator,pSVar13,0);
      }
      goto LAB_0019a57f;
    }
    pVVar9 = (VmModule *)(node->super_ExprBase).source;
    VVar16 = GetVmType(ctx,pTVar15);
    pTVar15 = VVar16.structType;
    VVar1 = ((VmType *)&(address->functions).tail)->type;
    uVar2 = ((VmType *)&(address->functions).tail)->size;
    VVar5 = VVar16.type;
    uVar14 = VVar16.size;
    if ((VVar1 != VVar5) || (uVar2 != uVar14)) {
      if (uVar14 == 4 && VVar5 == VM_TYPE_INT) {
        if (uVar2 == 8 && VVar1 == VM_TYPE_DOUBLE) {
          VVar16.structType = pTVar15;
          VVar16.type = VM_TYPE_INT;
          VVar16.size = 4;
          pTVar15 = (TypeBase *)0xf;
        }
        else {
          if ((VVar1 != VM_TYPE_LONG) || (uVar2 != 8)) goto LAB_0019aac7;
          VVar16.structType = pTVar15;
          VVar16.type = VM_TYPE_INT;
          VVar16.size = 4;
          pTVar15 = (TypeBase *)0x15;
        }
      }
      else if (uVar14 == 8 && VVar5 == VM_TYPE_DOUBLE) {
        if (uVar2 == 4 && VVar1 == VM_TYPE_INT) {
          VVar16.structType = pTVar15;
          VVar16.type = VM_TYPE_DOUBLE;
          VVar16.size = 8;
          pTVar15 = (TypeBase *)0x12;
        }
        else {
          if ((VVar1 != VM_TYPE_LONG) || (uVar2 != 8)) goto LAB_0019aac7;
          VVar16.structType = pTVar15;
          VVar16.type = VM_TYPE_DOUBLE;
          VVar16.size = 8;
          pTVar15 = (TypeBase *)0x13;
        }
      }
      else {
        if ((VVar5 != VM_TYPE_LONG) || (uVar14 != 8)) {
LAB_0019aac7:
          __assert_fail("!\"unknown cast\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x206,
                        "VmValue *(anonymous namespace)::CreateCast(VmModule *, SynBase *, VmValue *, VmType)"
                       );
        }
        if (uVar2 == 4 && VVar1 == VM_TYPE_INT) {
          VVar16.structType = pTVar15;
          VVar16.type = VM_TYPE_LONG;
          VVar16.size = 8;
          pTVar15 = (TypeBase *)0x14;
        }
        else {
          if ((VVar1 != VM_TYPE_DOUBLE) || (uVar2 != 8)) goto LAB_0019aac7;
          VVar16.structType = pTVar15;
          VVar16.type = VM_TYPE_LONG;
          VVar16.size = 8;
          pTVar15 = (TypeBase *)0x10;
        }
      }
LAB_0019aa3e:
      type_01._0_8_ = VVar16.structType;
      type_01.structType = pTVar15;
      address = (VmModule *)
                anon_unknown.dwarf_10d873::CreateInstruction
                          ((anon_unknown_dwarf_10d873 *)module,pVVar9,VVar16._0_8_,type_01,
                           (VmInstructionType)address,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                           (VmValue *)0x0,in_stack_ffffffffffffffb8);
    }
    goto LAB_0019a850;
  case EXPR_CAST_PTR_TO_BOOL:
    pSVar13 = (node->super_ExprBase).source;
    pVVar7 = CreateConstantPointer
                       (module->allocator,pSVar13,0,(VariableData *)0x0,ctx->typeNullPtr,false);
LAB_0019a57f:
    address = (VmModule *)
              anon_unknown.dwarf_10d873::CreateCompareNotEqual
                        (module,pSVar13,(VmValue *)address,&pVVar7->super_VmValue);
    goto LAB_0019a850;
  case EXPR_CAST_UNSIZED_TO_BOOL:
    pVVar12 = (VmValue *)node->value->type;
    if ((pVVar12 == (VmValue *)0x0) || (pVVar12->typeID != 0x14)) {
      pVVar12 = (VmValue *)0x0;
    }
    if (pVVar12 != (VmValue *)0x0) {
      pVVar9 = (VmModule *)(node->super_ExprBase).source;
      pTVar6 = ExpressionContext::GetReferenceType(ctx,(TypeBase *)(pVVar12->users).little[7]);
      if (pTVar6 == (TypeRef *)0x0) {
LAB_0019aa4b:
        __assert_fail("structType",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.h"
                      ,0xcd,"static const VmType VmType::Pointer(TypeBase *)");
      }
      type_00.structType = (TypeBase *)address;
      type_00._0_8_ = pTVar6;
      pVVar10 = anon_unknown.dwarf_10d873::CreateExtract
                          ((anon_unknown_dwarf_10d873 *)module,pVVar9,(SynBase *)0x800000006,type_00
                           ,(VmValue *)0x0,in_stack_ffffffffffffff98);
      pSVar13 = (node->super_ExprBase).source;
      pVVar7 = CreateConstantPointer
                         (module->allocator,pSVar13,0,(VariableData *)0x0,ctx->typeNullPtr,false);
LAB_0019a4c5:
      module = (VmModule *)
               anon_unknown.dwarf_10d873::CreateCompareNotEqual
                         (module,pSVar13,pVVar10,&pVVar7->super_VmValue);
LAB_0019a83a:
      anon_unknown.dwarf_10d873::CheckType(ctx,&node->super_ExprBase,(VmValue *)module);
    }
    break;
  case EXPR_CAST_FUNCTION_TO_BOOL:
    auVar4._8_8_ = 0;
    auVar4._0_8_ = address;
    pVVar10 = anon_unknown.dwarf_10d873::CreateExtract
                        ((anon_unknown_dwarf_10d873 *)module,
                         (VmModule *)(node->super_ExprBase).source,(SynBase *)0x400000001,
                         (VmType)(auVar4 << 0x40),(VmValue *)0x8,in_stack_ffffffffffffff98);
    pVVar12 = pVVar10;
    if (pVVar10 != (VmValue *)0x0) {
      pSVar13 = (node->super_ExprBase).source;
      pVVar7 = CreateConstantInt(module->allocator,pSVar13,0);
      goto LAB_0019a4c5;
    }
    break;
  case EXPR_CAST_NULL_TO_PTR:
    address = (VmModule *)
              CreateConstantPointer
                        (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                         (node->super_ExprBase).type,false);
    goto LAB_0019a850;
  case EXPR_CAST_NULL_TO_AUTO_PTR:
    pSVar13 = (node->super_ExprBase).source;
    VVar16 = GetVmType(ctx,(node->super_ExprBase).type);
    el0 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
    pVVar7 = CreateConstantPointer
                       (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                        ctx->typeNullPtr,false);
    goto LAB_0019a692;
  case EXPR_CAST_NULL_TO_UNSIZED:
  case EXPR_CAST_NULL_TO_FUNCTION:
    pSVar13 = (node->super_ExprBase).source;
    VVar16 = GetVmType(ctx,(node->super_ExprBase).type);
    el0 = CreateConstantPointer
                    (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                     ctx->typeNullPtr,false);
    pVVar7 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
LAB_0019a692:
    el2 = (VmConstant *)0x0;
LAB_0019a7a8:
    address = (VmModule *)
              anon_unknown.dwarf_10d873::CreateConstruct
                        (module,pSVar13,VVar16,&el0->super_VmValue,&pVVar7->super_VmValue,
                         &el2->super_VmValue,in_stack_ffffffffffffffa0);
    goto LAB_0019a850;
  case EXPR_CAST_NULL_TO_AUTO_ARRAY:
    pSVar13 = (node->super_ExprBase).source;
    VVar16 = GetVmType(ctx,(node->super_ExprBase).type);
    el0 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
    pVVar7 = CreateConstantPointer
                       (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                        ctx->typeNullPtr,false);
    el2 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
    goto LAB_0019a7a8;
  case EXPR_CAST_ARRAY_PTR_TO_UNSIZED:
    pVVar12 = (VmValue *)node->value->type;
    if ((pVVar12 == (VmValue *)0x0) || (pVVar12->typeID != 0x12)) {
      pVVar12 = (VmValue *)0x0;
    }
    if (pVVar12 != (VmValue *)0x0) {
      pVVar10 = (pVVar12->users).little[2];
      if ((pVVar10 == (VmValue *)0x0) || (pVVar10->typeID != 0x13)) {
        pVVar10 = (VmValue *)0x0;
      }
      if (pVVar10 == (VmValue *)0x0) {
        __assert_fail("arrType",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0xaba,
                      "VmValue *CompileVmTypeCast(ExpressionContext &, VmModule *, ExprTypeCast *)")
        ;
      }
      if (*(int *)((long)(pVVar10->users).little + 0x1c) != 0) {
        __assert_fail("unsigned(arrType->length) == arrType->length",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0xabb,
                      "VmValue *CompileVmTypeCast(ExpressionContext &, VmModule *, ExprTypeCast *)")
        ;
      }
      pSVar13 = (node->super_ExprBase).source;
      VVar16 = GetVmType(ctx,(node->super_ExprBase).type);
      pVVar9 = (VmModule *)
               CreateConstantInt(module->allocator,(node->super_ExprBase).source,
                                 *(int *)((pVVar10->users).little + 3));
      pVVar8 = address;
LAB_0019a835:
      module = (VmModule *)
               anon_unknown.dwarf_10d873::CreateConstruct
                         (module,pSVar13,VVar16,(VmValue *)pVVar8,(VmValue *)pVVar9,(VmValue *)0x0,
                          in_stack_ffffffffffffffa0);
      goto LAB_0019a83a;
    }
    break;
  case EXPR_CAST_PTR_TO_AUTO_PTR:
    pVVar12 = (VmValue *)node->value->type;
    if ((pVVar12 == (VmValue *)0x0) || (pVVar12->typeID != 0x12)) {
      pVVar12 = (VmValue *)0x0;
    }
    if (pVVar12 != (VmValue *)0x0) {
      pVVar10 = (pVVar12->users).little[2];
      if ((pVVar10 == (VmValue *)0x0) || (pVVar11 = pVVar10, pVVar10->typeID != 0x18)) {
        pVVar11 = (VmValue *)0x0;
      }
      if ((pVVar11 == (VmValue *)0x0) ||
         ((*(char *)(pVVar11[1].users.little + 5) == '\0' &&
          (pVVar11[1].users.little[6] == (VmValue *)0x0)))) {
        pVVar8 = (VmModule *)
                 anon_unknown.dwarf_10d873::CreateTypeIndex
                           (module,(node->super_ExprBase).source,(TypeBase *)pVVar10);
      }
      else {
        pVVar8 = (VmModule *)
                 anon_unknown.dwarf_10d873::CreateLoad
                           (ctx,module,(node->super_ExprBase).source,ctx->typeTypeID,
                            (VmValue *)address,in_R9D);
      }
      pSVar13 = (node->super_ExprBase).source;
      VVar16 = GetVmType(ctx,(node->super_ExprBase).type);
      goto LAB_0019a835;
    }
    break;
  case EXPR_CAST_AUTO_PTR_TO_PTR:
    pVVar12 = (VmValue *)(node->super_ExprBase).type;
    if ((pVVar12 == (VmValue *)0x0) || (pVVar12->typeID != 0x12)) {
      pVVar12 = (VmValue *)0x0;
    }
    if (pVVar12 != (VmValue *)0x0) {
      pVVar9 = (VmModule *)(node->super_ExprBase).source;
      pVVar10 = (pVVar12->users).little[2];
      pTVar6 = ExpressionContext::GetReferenceType(ctx,(TypeBase *)pVVar10);
      if (pTVar6 == (TypeRef *)0x0) goto LAB_0019aa4b;
      pVVar8 = pVVar9;
      pVVar7 = CreateConstantInt(module->allocator,(SynBase *)pVVar9,
                                 *(uint *)&(pVVar10->comment).begin);
      type.structType = (TypeBase *)0x47;
      type._0_8_ = pTVar6;
      module = (VmModule *)
               anon_unknown.dwarf_10d873::CreateInstruction
                         ((anon_unknown_dwarf_10d873 *)module,pVVar9,(SynBase *)0x800000006,type,
                          (VmInstructionType)address,&pVVar7->super_VmValue,(VmValue *)0x0,
                          (VmValue *)0x0,(VmValue *)0x0,(VmValue *)pVVar8);
      anon_unknown.dwarf_10d873::CheckType(ctx,&node->super_ExprBase,(VmValue *)module);
    }
    break;
  case EXPR_CAST_UNSIZED_TO_AUTO_ARRAY:
    pVVar12 = (VmValue *)node->value->type;
    if ((pVVar12 == (VmValue *)0x0) || (pVVar12->typeID != 0x14)) {
      pVVar12 = (VmValue *)0x0;
    }
    if (pVVar12 != (VmValue *)0x0) {
      pSVar13 = (node->super_ExprBase).source;
      VVar16 = GetVmType(ctx,(node->super_ExprBase).type);
      pVVar8 = (VmModule *)
               anon_unknown.dwarf_10d873::CreateTypeIndex
                         (module,(node->super_ExprBase).source,
                          (TypeBase *)(pVVar12->users).little[7]);
      goto LAB_0019a835;
    }
    break;
  case EXPR_CAST_REINTERPRET:
    pTVar15 = (node->super_ExprBase).type;
    pTVar3 = node->value->type;
    if (((pTVar15 != pTVar3) && (pTVar15 != (TypeBase *)0x0)) &&
       (((pTVar3 != (TypeBase *)0x0 && ((pTVar15->typeID == 0x14 && (pTVar3->typeID == 0x14)))) ||
        ((pTVar15 != (TypeBase *)0x0 &&
         ((((pTVar3 != (TypeBase *)0x0 && (pTVar15->typeID == 0x12)) && (pTVar3->typeID == 0x12)) ||
          (((pTVar15 != (TypeBase *)0x0 && (pTVar3 != (TypeBase *)0x0)) &&
           ((pTVar15->typeID == 0x15 && (pTVar3->typeID == 0x15)))))))))))) {
      if ((address == (VmModule *)0x0) || (*(uint *)&(address->functions).head != 2)) {
        pVVar9 = (VmModule *)0x0;
      }
      if ((pVVar9 == (VmModule *)0x0) || (*(int *)&(pVVar9->loopInfo).little[5].breakBlock != 0x1f))
      {
        pVVar9 = (VmModule *)(node->super_ExprBase).source;
        VVar16 = GetVmType(ctx,(node->super_ExprBase).type);
        pTVar15 = (TypeBase *)0x4e;
        goto LAB_0019aa3e;
      }
      VVar16 = GetVmType(ctx,pTVar15);
      *(VmType *)&(pVVar9->functions).tail = VVar16;
    }
    goto LAB_0019a850;
  default:
    __assert_fail("!\"unknown cast\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xb12,
                  "VmValue *CompileVmTypeCast(ExpressionContext &, VmModule *, ExprTypeCast *)");
  }
  if (pVVar12 == (VmValue *)0x0) {
LAB_0019a850:
    module = address;
    anon_unknown.dwarf_10d873::CheckType(ctx,&node->super_ExprBase,(VmValue *)module);
  }
  return (VmValue *)module;
}

Assistant:

VmValue* CompileVmTypeCast(ExpressionContext &ctx, VmModule *module, ExprTypeCast *node)
{
	VmValue *value = CompileVm(ctx, module, node->value);

	switch(node->category)
	{
	case EXPR_CAST_NUMERICAL:
		if(node->type == ctx.typeBool)
		{
			if(value->type == VmType::Int)
				return CheckType(ctx, node, CreateCompareNotEqual(module, node->source, value, CreateConstantInt(module->allocator, node->source, 0)));

			if(value->type == VmType::Double)
				return CheckType(ctx, node, CreateCompareNotEqual(module, node->source, value, CreateConstantDouble(module->allocator, node->source, 0.0)));

			if(value->type == VmType::Long)
				return CheckType(ctx, node, CreateCompareNotEqual(module, node->source, value, CreateConstantLong(module->allocator, node->source, 0ll)));

			assert(!"unknown type");
		}

		return CheckType(ctx, node, CreateCast(module, node->source, value, GetVmType(ctx, node->type)));
	case EXPR_CAST_PTR_TO_BOOL:
		return CheckType(ctx, node, CreateCompareNotEqual(module, node->source, value, CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false)));
	case EXPR_CAST_UNSIZED_TO_BOOL:
		if(TypeUnsizedArray *unsizedArrType = getType<TypeUnsizedArray>(node->value->type))
		{
			VmValue *ptr = CreateExtract(module, node->source, VmType::Pointer(ctx.GetReferenceType(unsizedArrType->subType)), value, 0);

			return CheckType(ctx, node, CreateCompareNotEqual(module, node->source, ptr, CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false)));
		}
		
		break;
	case EXPR_CAST_FUNCTION_TO_BOOL:
		if(VmValue *index = CreateExtract(module, node->source, VmType::Int, value, sizeof(void*)))
		{
			return CheckType(ctx, node, CreateCompareNotEqual(module, node->source, index, CreateConstantInt(module->allocator, node->source, 0)));
		}

		break;
	case EXPR_CAST_NULL_TO_PTR:
		return CheckType(ctx, node, CreateConstantPointer(module->allocator, node->source, 0, NULL, node->type, false));
	case EXPR_CAST_NULL_TO_AUTO_PTR:
		return CheckType(ctx, node, CreateConstruct(module, node->source, GetVmType(ctx, node->type), CreateConstantInt(module->allocator, node->source, 0), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), NULL, NULL));
	case EXPR_CAST_NULL_TO_UNSIZED:
		return CheckType(ctx, node, CreateConstruct(module, node->source, GetVmType(ctx, node->type), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL, NULL));
	case EXPR_CAST_NULL_TO_AUTO_ARRAY:
		return CheckType(ctx, node, CreateConstruct(module, node->source, GetVmType(ctx, node->type), CreateConstantInt(module->allocator, node->source, 0), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL));
	case EXPR_CAST_NULL_TO_FUNCTION:
		return CheckType(ctx, node, CreateConstruct(module, node->source, GetVmType(ctx, node->type), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL, NULL));
	case EXPR_CAST_ARRAY_PTR_TO_UNSIZED:
		if(TypeRef *refType = getType<TypeRef>(node->value->type))
		{
			TypeArray *arrType = getType<TypeArray>(refType->subType);

			assert(arrType);
			assert(unsigned(arrType->length) == arrType->length);

			return CheckType(ctx, node, CreateConstruct(module, node->source, GetVmType(ctx, node->type), value, CreateConstantInt(module->allocator, node->source, unsigned(arrType->length)), NULL, NULL));
		}

		break;
	case EXPR_CAST_PTR_TO_AUTO_PTR:
		if(TypeRef *refType = getType<TypeRef>(node->value->type))
		{
			TypeClass *classType = getType<TypeClass>(refType->subType);

			VmValue *typeId = NULL;

			if(classType && (classType->extendable || classType->baseClass))
				typeId = CreateLoad(ctx, module, node->source, ctx.typeTypeID, value, 0);
			else
				typeId = CreateTypeIndex(module, node->source, refType->subType);

			return CheckType(ctx, node, CreateConstruct(module, node->source, GetVmType(ctx, node->type), typeId, value, NULL, NULL));
		}
		break;
	case EXPR_CAST_AUTO_PTR_TO_PTR:
		if(TypeRef *refType = getType<TypeRef>(node->type))
		{
			return CheckType(ctx, node, CreateConvertPtr(module, node->source, value, refType->subType, ctx.GetReferenceType(refType->subType)));
		}

		break;
	case EXPR_CAST_UNSIZED_TO_AUTO_ARRAY:
		if(TypeUnsizedArray *unsizedType = getType<TypeUnsizedArray>(node->value->type))
		{
			return CheckType(ctx, node, CreateConstruct(module, node->source, GetVmType(ctx, node->type), CreateTypeIndex(module, node->source, unsizedType->subType), value, NULL, NULL));
		}

		break;
	case EXPR_CAST_REINTERPRET:
		if(node->type == node->value->type)
			return CheckType(ctx, node, value);

		if(isType<TypeUnsizedArray>(node->type) && isType<TypeUnsizedArray>(node->value->type))
		{
			// Try changing the target call type
			if(VmInstruction *inst = getType<VmInstruction>(value))
			{
				if(inst->cmd == VM_INST_CALL)
				{
					inst->type = GetVmType(ctx, node->type);

					return CheckType(ctx, node, value);
				}
			}

			return CheckType(ctx, node, CreateBitcast(module, node->source, GetVmType(ctx, node->type), value));
		}
		else if(isType<TypeRef>(node->type) && isType<TypeRef>(node->value->type))
		{
			// Try changing the target call type
			if(VmInstruction *inst = getType<VmInstruction>(value))
			{
				if(inst->cmd == VM_INST_CALL)
				{
					inst->type = GetVmType(ctx, node->type);

					return CheckType(ctx, node, value);
				}
			}

			return CheckType(ctx, node, CreateBitcast(module, node->source, GetVmType(ctx, node->type), value));
		}
		else if(isType<TypeFunction>(node->type) && isType<TypeFunction>(node->value->type))
		{
			// Try changing the target call type
			if(VmInstruction *inst = getType<VmInstruction>(value))
			{
				if(inst->cmd == VM_INST_CALL)
				{
					inst->type = GetVmType(ctx, node->type);

					return CheckType(ctx, node, value);
				}
			}

			return CheckType(ctx, node, CreateBitcast(module, node->source, GetVmType(ctx, node->type), value));
		}

		return CheckType(ctx, node, value);
	default:
		assert(!"unknown cast");
	}

	return CheckType(ctx, node, value);
}